

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

void jsoncons::detail::fill_exponent<jsoncons::string_sink<std::__cxx11::string>>
               (int K,string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *result)

{
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  int in_EDI;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000158;
  int in_stack_00000164;
  value_type in_stack_ffffffffffffffef;
  undefined4 local_4;
  
  if (in_EDI < 0) {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
    local_4 = -in_EDI;
  }
  else {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
    local_4 = in_EDI;
  }
  if (local_4 < 10) {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
  }
  else if (local_4 < 100) {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
  }
  else if (local_4 < 1000) {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RSI,in_stack_ffffffffffffffef);
  }
  else {
    from_integer<int,jsoncons::string_sink<std::__cxx11::string>>
              (in_stack_00000164,in_stack_00000158);
  }
  return;
}

Assistant:

void fill_exponent(int K, Result& result)
    {
        if (K < 0)
        {
            result.push_back('-');
            K = -K;
        }
        else
        {
            result.push_back('+'); // compatibility with sprintf
        }

        if (K < 10)
        {
            result.push_back('0'); // compatibility with sprintf
            result.push_back((char)('0' + K));
        }
        else if (K < 100)
        {
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else if (K < 1000)
        {
            result.push_back((char)('0' + K / 100)); K %= 100;
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else
        {
            jsoncons::detail::from_integer(K, result);
        }
    }